

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

void __thiscall
filtered_directed_graph_t::filtered_directed_graph_t
          (filtered_directed_graph_t *this,vector<float,_std::allocator<float>_> *_vertex_filtration
          ,bool directed)

{
  unsigned_short uVar1;
  size_type sVar2;
  length_error *this_00;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  float in_stack_00000028;
  bool in_stack_0000002d;
  vertex_index_t in_stack_0000002e;
  directed_graph_t *in_stack_00000030;
  
  std::vector<float,_std::allocator<float>_>::size(in_RSI);
  directed_graph_t::directed_graph_t
            (in_stack_00000030,in_stack_0000002e,in_stack_0000002d,in_stack_00000028);
  std::vector<float,_std::allocator<float>_>::vector(unaff_retaddr,in_RDI);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14c412);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if (uVar1 < sVar2) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,"Too many vertices. Consider compiling flagser with MANY_VERTICES enabled.");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  return;
}

Assistant:

filtered_directed_graph_t(const std::vector<value_t> _vertex_filtration, bool directed)
	    : directed_graph_t(vertex_index_t(_vertex_filtration.size()), directed), vertex_filtration(_vertex_filtration) {
		if (_vertex_filtration.size() > size_t(std::numeric_limits<vertex_index_t>::max()))
			throw std::length_error("Too many vertices. Consider compiling flagser with MANY_VERTICES enabled.");
	}